

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

bool vkb::detail::GenericFeaturesPNextNode::match
               (GenericFeaturesPNextNode *requested,GenericFeaturesPNextNode *supported)

{
  uint local_24;
  uint32_t i;
  GenericFeaturesPNextNode *supported_local;
  GenericFeaturesPNextNode *requested_local;
  
  if (requested->sType != supported->sType) {
    __assert_fail("requested.sType == supported.sType && \"Non-matching sTypes in features nodes!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                  ,0x31,
                  "static bool vkb::detail::GenericFeaturesPNextNode::match(const GenericFeaturesPNextNode &, const GenericFeaturesPNextNode &)"
                 );
  }
  local_24 = 0;
  while( true ) {
    if (0xff < local_24) {
      return true;
    }
    if ((requested->fields[local_24] != 0) && (supported->fields[local_24] == 0)) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool GenericFeaturesPNextNode::match(GenericFeaturesPNextNode const& requested, GenericFeaturesPNextNode const& supported) noexcept {
    assert(requested.sType == supported.sType && "Non-matching sTypes in features nodes!");
    for (uint32_t i = 0; i < field_capacity; i++) {
        if (requested.fields[i] && !supported.fields[i]) return false;
    }
    return true;
}